

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

void __thiscall
wasm::OptimizeInstructions::visitStructNew(OptimizeInstructions *this,StructNew *curr)

{
  pointer pFVar1;
  Type this_00;
  bool bVar2;
  Struct *pSVar3;
  Expression **ppEVar4;
  Expression *pEVar5;
  uint uVar6;
  ulong index;
  Literal local_80;
  anon_union_16_6_1532cd5a_for_Literal_0 local_68;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *local_50;
  Type local_48;
  Type type;
  
  if (((curr->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression.type.id != 1) &&
     ((curr->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements != 0)) {
    type.id = (uintptr_t)this;
    local_68.i64 = (int64_t)wasm::Type::getHeapType
                                      (&(curr->super_SpecificExpression<(wasm::Expression::Id)65>).
                                        super_Expression.type);
    pSVar3 = HeapType::getStruct((HeapType *)&local_68.func);
    if ((long)(pSVar3->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl
              .super__Vector_impl_data._M_finish -
        (long)(pSVar3->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl
              .super__Vector_impl_data._M_start >> 4 !=
        (curr->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
        usedElements) {
      __assert_fail("fields.size() == curr->operands.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeInstructions.cpp"
                    ,0x726,"void wasm::OptimizeInstructions::visitStructNew(StructNew *)");
    }
    local_50 = &(curr->operands).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>;
    uVar6 = 0;
    do {
      this_00.id = type.id;
      index = (ulong)uVar6;
      pFVar1 = (pSVar3->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(pSVar3->fields).
                        super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pFVar1 >> 4) <= index) {
        pEVar5 = getDroppedChildrenAndAppend
                           ((OptimizeInstructions *)type.id,(Expression *)curr,(Expression *)curr);
        (curr->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
        usedElements = 0;
        replaceCurrent((OptimizeInstructions *)this_00.id,pEVar5);
        return;
      }
      local_48.id = pFVar1[index].type.id;
      bVar2 = wasm::Type::isDefaultable(&local_48);
      if (!bVar2) {
        return;
      }
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (local_50,index);
      pEVar5 = getFallthrough((OptimizeInstructions *)type.id,*ppEVar4);
      bVar2 = Properties::isSingleConstantExpression(pEVar5);
      if (!bVar2) {
        return;
      }
      Properties::getLiteral((Literal *)&local_68.func,pEVar5);
      Literal::makeZero(&local_80,local_48);
      bVar2 = Literal::operator!=((Literal *)&local_68.func,&local_80);
      Literal::~Literal(&local_80);
      Literal::~Literal((Literal *)&local_68.func);
      uVar6 = uVar6 + 1;
    } while (!bVar2);
  }
  return;
}

Assistant:

void visitStructNew(StructNew* curr) {
    // If values are provided, but they are all the default, then we can remove
    // them (in reachable code).
    if (curr->type == Type::unreachable || curr->isWithDefault()) {
      return;
    }

    const auto& fields = curr->type.getHeapType().getStruct().fields;
    assert(fields.size() == curr->operands.size());

    for (Index i = 0; i < fields.size(); i++) {
      // The field must be defaultable.
      auto type = fields[i].type;
      if (!type.isDefaultable()) {
        return;
      }

      // The field must be written the default value.
      auto* value = getFallthrough(curr->operands[i]);
      if (!Properties::isSingleConstantExpression(value) ||
          Properties::getLiteral(value) != Literal::makeZero(type)) {
        return;
      }
    }

    // Success! Drop the children and return a struct.new_with_default.
    auto* rep = getDroppedChildrenAndAppend(curr, curr);
    curr->operands.clear();
    assert(curr->isWithDefault());
    replaceCurrent(rep);
  }